

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_set_last_insert_rowid(sqlite3 *db,sqlite3_int64 iRowid)

{
  if (db->mutex == (sqlite3_mutex *)0x0) {
    db->lastRowid = iRowid;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    db->lastRowid = iRowid;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_set_last_insert_rowid(sqlite3 *db, sqlite3_int64 iRowid){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  db->lastRowid = iRowid;
  sqlite3_mutex_leave(db->mutex);
}